

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall
Json::OurReader::decodeUnicodeEscapeSequence
          (OurReader *this,Token *token,Location *current,Location end,uint *ret_unicode)

{
  char *pcVar1;
  int iVar2;
  allocator local_99;
  string local_98;
  char local_75;
  int local_74;
  uint uStack_70;
  Char c;
  int index;
  int unicode;
  allocator local_59;
  string local_58;
  uint *local_38;
  uint *ret_unicode_local;
  Location end_local;
  Location *current_local;
  Token *token_local;
  OurReader *this_local;
  
  local_38 = ret_unicode;
  ret_unicode_local = (uint *)end;
  end_local = (Location)current;
  current_local = (Location *)token;
  token_local = (Token *)this;
  if ((long)end - (long)*current < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_58,"Bad unicode escape sequence in string: four digits expected.",
               &local_59);
    this_local._7_1_ = addError(this,&local_58,(Token *)current_local,*(Location *)end_local);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  else {
    uStack_70 = 0;
    for (local_74 = 0; local_74 < 4; local_74 = local_74 + 1) {
      pcVar1 = *current;
      *current = pcVar1 + 1;
      local_75 = *pcVar1;
      uStack_70 = uStack_70 * 0x10;
      if ((local_75 < '0') || ('9' < local_75)) {
        if ((local_75 < 'a') || ('f' < local_75)) {
          if ((local_75 < 'A') || ('F' < local_75)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_98,
                       "Bad unicode escape sequence in string: hexadecimal digit expected.",
                       &local_99);
            this_local._7_1_ =
                 addError(this,&local_98,(Token *)current_local,*(Location *)end_local);
            std::__cxx11::string::~string((string *)&local_98);
            std::allocator<char>::~allocator((allocator<char> *)&local_99);
            goto LAB_00119ac9;
          }
          iVar2 = local_75 + -0x37;
        }
        else {
          iVar2 = local_75 + -0x57;
        }
      }
      else {
        iVar2 = local_75 + -0x30;
      }
      uStack_70 = iVar2 + uStack_70;
    }
    *ret_unicode = uStack_70;
    this_local._7_1_ = 1;
  }
LAB_00119ac9:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OurReader::decodeUnicodeEscapeSequence(Token& token,
                                         Location& current,
                                         Location end,
                                         unsigned int& ret_unicode) {
  if (end - current < 4)
    return addError(
        "Bad unicode escape sequence in string: four digits expected.",
        token,
        current);
  int unicode = 0;
  for (int index = 0; index < 4; ++index) {
    Char c = *current++;
    unicode *= 16;
    if (c >= '0' && c <= '9')
      unicode += c - '0';
    else if (c >= 'a' && c <= 'f')
      unicode += c - 'a' + 10;
    else if (c >= 'A' && c <= 'F')
      unicode += c - 'A' + 10;
    else
      return addError(
          "Bad unicode escape sequence in string: hexadecimal digit expected.",
          token,
          current);
  }
  ret_unicode = static_cast<unsigned int>(unicode);
  return true;
}